

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O1

void duckdb::BinaryExecutor::
     ExecuteConstant<duckdb::string_t,duckdb::date_t,duckdb::timestamp_t,duckdb::BinaryStandardOperatorWrapper,duckdb::DateTruncBinaryOperator,bool>
               (Vector *left,Vector *right,Vector *result,bool fun)

{
  unsigned_long *puVar1;
  int64_t *piVar2;
  timestamp_t tVar3;
  string_t specifier;
  
  Vector::SetVectorType(result,CONSTANT_VECTOR);
  puVar1 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
  piVar2 = (int64_t *)result->data;
  if (((puVar1 == (unsigned_long *)0x0) || ((*puVar1 & 1) != 0)) &&
     ((puVar1 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask,
      puVar1 == (unsigned_long *)0x0 || ((*puVar1 & 1) != 0)))) {
    specifier.value._8_4_ = *(undefined4 *)right->data;
    specifier.value._0_8_ = *(undefined8 *)(left->data + 8);
    specifier.value._12_4_ = 0;
    tVar3 = DateTruncBinaryOperator::Operation<duckdb::string_t,duckdb::date_t,duckdb::timestamp_t>
                      (*(DateTruncBinaryOperator **)left->data,specifier,
                       (date_t)(int32_t)right->data);
    *piVar2 = tVar3.value;
    return;
  }
  ConstantVector::SetNull(result,true);
  return;
}

Assistant:

static void ExecuteConstant(Vector &left, Vector &right, Vector &result, FUNC fun) {
		result.SetVectorType(VectorType::CONSTANT_VECTOR);

		auto ldata = ConstantVector::GetData<LEFT_TYPE>(left);
		auto rdata = ConstantVector::GetData<RIGHT_TYPE>(right);
		auto result_data = ConstantVector::GetData<RESULT_TYPE>(result);

		if (ConstantVector::IsNull(left) || ConstantVector::IsNull(right)) {
			ConstantVector::SetNull(result, true);
			return;
		}
		*result_data = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
		    fun, *ldata, *rdata, ConstantVector::Validity(result), 0);
	}